

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O2

Address * __thiscall
cfd::AddressFactory::GetAddressByLockingScript
          (Address *__return_storage_ptr__,AddressFactory *this,Script *locking_script)

{
  ScriptType SVar1;
  bool bVar2;
  ScriptOperator *pSVar3;
  CfdException *this_00;
  Pubkey pubkey;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> items;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  core::Script::GetElementList(&items,locking_script);
  bVar2 = core::Script::IsP2pkScript(locking_script);
  if (bVar2) {
    core::ScriptElement::GetBinaryData
              ((ByteData *)&local_38,
               items.
               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
               ._M_impl.super__Vector_impl_data._M_start);
    core::Pubkey::Pubkey(&pubkey,(ByteData *)&local_38);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
    CreateP2pkhAddress(__return_storage_ptr__,this,&pubkey);
  }
  else {
    bVar2 = core::Script::IsP2pkhScript(locking_script);
    if (bVar2) {
      core::ScriptElement::GetBinaryData
                ((ByteData *)&local_50,
                 items.
                 super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ._M_impl.super__Vector_impl_data._M_start + 2);
      core::ByteData::GetBytes
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,
                 (ByteData *)&local_50);
      core::ByteData160::ByteData160
                ((ByteData160 *)&pubkey,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
      GetAddressByHash(__return_storage_ptr__,this,kP2pkhAddress,(ByteData160 *)&pubkey);
    }
    else {
      bVar2 = core::Script::IsP2shScript(locking_script);
      if (bVar2) {
        core::ScriptElement::GetBinaryData
                  ((ByteData *)&local_50,
                   items.
                   super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1);
        core::ByteData::GetBytes
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,
                   (ByteData *)&local_50);
        core::ByteData160::ByteData160
                  ((ByteData160 *)&pubkey,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
        GetAddressByHash(__return_storage_ptr__,this,kP2shAddress,(ByteData160 *)&pubkey);
      }
      else {
        bVar2 = core::Script::IsP2wpkhScript(locking_script);
        if (!bVar2) {
          bVar2 = core::Script::IsP2wshScript(locking_script);
          if (!bVar2) {
            bVar2 = core::Script::IsTaprootScript(locking_script);
            if (!bVar2) {
              bVar2 = core::Script::IsWitnessProgram(locking_script);
              if (bVar2) {
                pSVar3 = core::ScriptElement::GetOpCode
                                   (items.
                                    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                bVar2 = core::ScriptOperator::operator!=
                                  (pSVar3,(ScriptOperator *)core::ScriptOperator::OP_0);
                if (bVar2) {
                  pSVar3 = core::ScriptElement::GetOpCode
                                     (items.
                                      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                  SVar1 = pSVar3->data_type_;
                  core::ScriptElement::GetBinaryData
                            (&pubkey.data_,
                             items.
                             super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                             ._M_impl.super__Vector_impl_data._M_start + 1);
                  GetSegwitAddressByHash
                            (__return_storage_ptr__,this,&pubkey.data_,
                             (SVar1 + kOpCheckMultiSigVerify & 0xff) + kVersion1);
                  goto LAB_0032e807;
                }
              }
              bVar2 = core::Script::IsMultisigScript(locking_script);
              this_00 = (CfdException *)__cxa_allocate_exception(0x30);
              if (bVar2) {
                std::__cxx11::string::string
                          ((string *)&pubkey,"script type is multisig script.",
                           (allocator *)&local_68);
                core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&pubkey)
                ;
                __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException)
                ;
              }
              std::__cxx11::string::string
                        ((string *)&pubkey,"unknown type locking script.",(allocator *)&local_68);
              core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&pubkey);
              __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
            }
            core::ScriptElement::GetBinaryData
                      (&pubkey.data_,
                       items.
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
            GetSegwitAddressByHash(__return_storage_ptr__,this,&pubkey.data_,kVersion1);
            goto LAB_0032e807;
          }
        }
        core::ScriptElement::GetBinaryData
                  (&pubkey.data_,
                   items.
                   super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1);
        GetSegwitAddressByHash(__return_storage_ptr__,this,&pubkey.data_);
      }
    }
  }
LAB_0032e807:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
  std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector(&items);
  return __return_storage_ptr__;
}

Assistant:

Address AddressFactory::GetAddressByLockingScript(
    const Script& locking_script) const {
  std::vector<ScriptElement> items = locking_script.GetElementList();
  if (locking_script.IsP2pkScript()) {
    Pubkey pubkey = Pubkey(items[0].GetBinaryData());
    return CreateP2pkhAddress(pubkey);
  } else if (locking_script.IsP2pkhScript()) {
    ByteData160 hash = ByteData160(items[2].GetBinaryData().GetBytes());
    return GetAddressByHash(AddressType::kP2pkhAddress, hash);
  } else if (locking_script.IsP2shScript()) {
    ByteData160 hash = ByteData160(items[1].GetBinaryData().GetBytes());
    return GetAddressByHash(AddressType::kP2shAddress, hash);
  } else if (
      locking_script.IsP2wpkhScript() || locking_script.IsP2wshScript()) {
    return GetSegwitAddressByHash(items[1].GetBinaryData());
  } else if (locking_script.IsTaprootScript()) {
    return GetSegwitAddressByHash(
        items[1].GetBinaryData(), WitnessVersion::kVersion1);
  } else if (
      locking_script.IsWitnessProgram() &&
      (items[0].GetOpCode() != ScriptOperator::OP_0)) {
    uint8_t var = items[0].GetOpCode().GetDataType() - ScriptType::kOp_1;
    return GetSegwitAddressByHash(
        items[1].GetBinaryData(), static_cast<WitnessVersion>(var + 1));
  } else if (locking_script.IsMultisigScript()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "script type is multisig script.");
  } else {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "unknown type locking script.");
  }
}